

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# translate.c
# Opt level: O3

void gen_op_iwmmxt_setpsr_nz(TCGContext_conflict1 *tcg_ctx)

{
  TCGTemp *ret;
  TCGTemp *local_18;
  
  ret = tcg_temp_new_internal_aarch64(tcg_ctx,TCG_TYPE_I32,false);
  local_18 = (TCGTemp *)(tcg_ctx->cpu_M0 + (long)tcg_ctx);
  tcg_gen_callN_aarch64(tcg_ctx,helper_iwmmxt_setpsr_nz_aarch64,ret,1,&local_18);
  tcg_gen_op3_aarch64(tcg_ctx,INDEX_op_st_i32,(TCGArg)ret,(TCGArg)(tcg_ctx->cpu_env + (long)tcg_ctx)
                      ,0x2fac);
  tcg_temp_free_internal_aarch64(tcg_ctx,ret);
  return;
}

Assistant:

static void gen_op_iwmmxt_setpsr_nz(TCGContext *tcg_ctx)
{
    TCGv_i32 tmp = tcg_temp_new_i32(tcg_ctx);
    gen_helper_iwmmxt_setpsr_nz(tcg_ctx, tmp, tcg_ctx->cpu_M0);
    store_cpu_field(tcg_ctx, tmp, iwmmxt.cregs[ARM_IWMMXT_wCASF]);
}